

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O2

void duckdb::StringParquetValueConversion::PlainSkip<true>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint uVar1;
  StringColumnReader *pSVar2;
  idx_t iVar3;
  
  pSVar2 = ColumnReader::Cast<duckdb::StringColumnReader>(reader);
  iVar3 = pSVar2->fixed_width_string_length;
  if (iVar3 == 0) {
    uVar1 = ByteBuffer::read<unsigned_int>(plain_data);
    iVar3 = (idx_t)uVar1;
  }
  ByteBuffer::inc(plain_data,iVar3 & 0xffffffff);
  return;
}

Assistant:

static void PlainSkip(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &scr = reader.Cast<StringColumnReader>();
		uint32_t str_len =
		    scr.fixed_width_string_length == 0 ? plain_data.read<uint32_t>() : scr.fixed_width_string_length;
		plain_data.inc(str_len);
	}